

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<int> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<int>::
Bind<std::function<cmCMakePresetsGraph::ReadFileResult(int&,Json::Value_const*)>>
          (Object<int> *this,string_view *name,
          function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *func,
          bool required)

{
  Object<int> *pOVar1;
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            ((function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)> *)&local_40
             ,func);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_40,required);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, F func, bool required = true)
    {
      return this->BindPrivate(name, MemberFunction(func), required);
    }